

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathCompExprPtr xmlXPathCtxtCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  xmlXPathParserContextPtr ctxt_00;
  xmlHashTablePtr pxVar1;
  xmlXPathContextPtr local_30;
  xmlXPathCompExprPtr comp;
  xmlXPathParserContextPtr pctxt;
  xmlChar *str_local;
  xmlXPathContextPtr ctxt_local;
  
  ctxt_local = (xmlXPathContextPtr)xmlXPathTryStreamCompile(ctxt,str);
  if (ctxt_local == (xmlXPathContextPtr)0x0) {
    xmlInitParser();
    ctxt_00 = xmlXPathNewParserContext(str,ctxt);
    if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
      ctxt_local = (xmlXPathContextPtr)0x0;
    }
    else {
      if (ctxt != (xmlXPathContextPtr)0x0) {
        ctxt->depth = 0;
      }
      xmlXPathCompileExpr(ctxt_00,1);
      if (ctxt_00->error == 0) {
        if (*ctxt_00->cur == '\0') {
          local_30 = (xmlXPathContextPtr)ctxt_00->comp;
          if ((1 < *(int *)&local_30->doc) && (-1 < local_30->nb_variables_unused)) {
            if (ctxt != (xmlXPathContextPtr)0x0) {
              ctxt->depth = 0;
            }
            xmlXPathOptimizeExpression
                      (ctxt_00,(xmlXPathStepOpPtr)
                               (&local_30->node->_private + (long)local_30->nb_variables_unused * 7)
                      );
          }
          ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
        }
        else {
          xmlXPatherror(ctxt_00,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                        ,0x37b3,7);
          local_30 = (xmlXPathContextPtr)0x0;
        }
        xmlXPathFreeParserContext(ctxt_00);
        if (local_30 != (xmlXPathContextPtr)0x0) {
          pxVar1 = (xmlHashTablePtr)xmlStrdup(str);
          local_30->varHash = pxVar1;
        }
        ctxt_local = local_30;
      }
      else {
        xmlXPathFreeParserContext(ctxt_00);
        ctxt_local = (xmlXPathContextPtr)0x0;
      }
    }
  }
  return (xmlXPathCompExprPtr)ctxt_local;
}

Assistant:

xmlXPathCompExprPtr
xmlXPathCtxtCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    xmlXPathParserContextPtr pctxt;
    xmlXPathCompExprPtr comp;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt, str);
    if (comp != NULL)
        return(comp);
#endif

    xmlInitParser();

    pctxt = xmlXPathNewParserContext(str, ctxt);
    if (pctxt == NULL)
        return NULL;
    if (ctxt != NULL)
        ctxt->depth = 0;
    xmlXPathCompileExpr(pctxt, 1);

    if( pctxt->error != XPATH_EXPRESSION_OK )
    {
        xmlXPathFreeParserContext(pctxt);
        return(NULL);
    }

    if (*pctxt->cur != 0) {
	/*
	 * aleksey: in some cases this line prints *second* error message
	 * (see bug #78858) and probably this should be fixed.
	 * However, we are not sure that all error messages are printed
	 * out in other places. It's not critical so we leave it as-is for now
	 */
	xmlXPatherror(pctxt, __FILE__, __LINE__, XPATH_EXPR_ERROR);
	comp = NULL;
    } else {
	comp = pctxt->comp;
	if ((comp->nbStep > 1) && (comp->last >= 0)) {
            if (ctxt != NULL)
                ctxt->depth = 0;
	    xmlXPathOptimizeExpression(pctxt, &comp->steps[comp->last]);
	}
	pctxt->comp = NULL;
    }
    xmlXPathFreeParserContext(pctxt);

    if (comp != NULL) {
	comp->expr = xmlStrdup(str);
#ifdef DEBUG_EVAL_COUNTS
	comp->string = xmlStrdup(str);
	comp->nb = 0;
#endif
    }
    return(comp);
}